

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_file_from_disk.unit.cpp
# Opt level: O0

void __thiscall
TestLoadJSONFromDisk_TestLoadClear3IGSDBV2JSON_Test::TestBody
          (TestLoadJSONFromDisk_TestLoadClear3IGSDBV2JSON_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double *pdVar3;
  variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>
  *__v;
  reference pvVar4;
  MeasurementComponent *pMVar5;
  AssertHelper local_c08;
  Message local_c00;
  undefined1 local_bf8 [8];
  AssertionResult gtest_ar_16;
  Message local_be0;
  undefined1 local_bd8 [8];
  AssertionResult gtest_ar_15;
  Message local_bc0;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar_14;
  Message local_ba0;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar_13;
  Message local_b80;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar_12;
  Message local_b60;
  undefined1 local_b58 [8];
  AssertionResult gtest_ar_11;
  Message local_b40;
  undefined1 local_b38 [8];
  AssertionResult gtest_ar_10;
  Message local_b20;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar_9;
  Message local_b00;
  int local_af4;
  size_type local_af0;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_8;
  vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *measurements;
  Message local_ac8;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar_7;
  Message local_aa8;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar_6;
  Message local_a88;
  double local_a80;
  undefined1 local_a78 [8];
  AssertionResult gtest_ar_5;
  Message local_a60;
  optional<double> local_a58;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar_4;
  Message local_a30;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar_3;
  Message local_a10;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_2;
  Message local_9f0;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_1;
  Message local_9d0;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar;
  undefined1 local_998 [8];
  ProductData product;
  undefined1 local_40 [8];
  path clear_3_path;
  ScopedTrace gtest_trace_41;
  TestLoadJSONFromDisk_TestLoadClear3IGSDBV2JSON_Test *this_local;
  
  testing::ScopedTrace::ScopedTrace
            ((ScopedTrace *)&clear_3_path.field_0x27,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
             ,0x29,"Begin Test: Load CLEAR_3_IGSDB_v2.json from disk.");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            ((path *)local_40,
             (char (*) [96])
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test"
             ,auto_format);
  std::filesystem::__cxx11::path::operator/=((path *)local_40,(char (*) [9])0x242623);
  std::filesystem::__cxx11::path::operator/=
            ((path *)local_40,(char (*) [22])"igsdb_v2_clear_3.json");
  std::filesystem::__cxx11::path::string((string *)&gtest_ar.message_,(path *)local_40);
  OpticsParser::parseJSONFile((ProductData *)local_998,(string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[20],_nullptr>
            ((EqHelper *)local_9c8,"product.name","\"Generic Clear Glass\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &product.super_enable_shared_from_this<OpticsParser::ProductData>._M_weak_this.
              super___weak_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char (*) [20])"Generic Clear Glass");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar1) {
    testing::Message::Message(&local_9d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_9e8,"product.productType","\"GLAZING\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &product.productName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged,(char (*) [8])"GLAZING");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  testing::internal::EqHelper::
  Compare<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char[11],_nullptr>
            ((EqHelper *)local_a08,"product.productSubtype","\"MONOLITHIC\"",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&product.manufacturer.field_2 + 8),(char (*) [11])"MONOLITHIC");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  pdVar3 = std::optional<double>::value((optional<double> *)&product.cgdbShadeMaterialId);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a28,"product.thickness.value()","3.048","1e-6",*pdVar3,3.048,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
  if (!bVar1) {
    testing::Message::Message(&local_a30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_a30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
  std::optional<double>::optional(&local_a58);
  testing::internal::EqHelper::Compare<std::optional<double>,_std::optional<double>,_nullptr>
            ((EqHelper *)local_a48,"product.conductivity","std::optional<double>()",
             (optional<double> *)
             &product.thickness.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged,&local_a58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
  if (!bVar1) {
    testing::Message::Message(&local_a60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_a60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
  pdVar3 = std::optional<double>::value
                     ((optional<double> *)
                      &product.conductivity.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_engaged);
  local_a80 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_a78,"product.IRTransmittance.value()","0.0",pdVar3,&local_a80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a78);
  if (!bVar1) {
    testing::Message::Message(&local_a88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_a88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_a88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a78);
  pdVar3 = std::optional<double>::value
                     ((optional<double> *)
                      &product.IRTransmittance.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_engaged);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_aa0,"product.frontEmissivity.value()","0.84","1e-6",*pdVar3,0.84,
             1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
  if (!bVar1) {
    testing::Message::Message(&local_aa8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_aa0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_aa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
  pdVar3 = std::optional<double>::value
                     ((optional<double> *)
                      &product.frontEmissivity.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_engaged);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_ac0,"product.backEmissivity.value()","0.84","1e-6",*pdVar3,0.84,1e-06
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
  if (!bVar1) {
    testing::Message::Message(&local_ac8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ac0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&measurements,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&measurements,&local_ac8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&measurements);
    testing::Message::~Message(&local_ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
  __v = std::
        optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
        ::value((optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
                 *)&product.wavelengthUnit.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::
         get<std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,OpticsParser::DualBandBSDF>
                   (__v);
  local_af0 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::size
                        ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                         gtest_ar_8.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_af4 = 0x6f;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ae8,"measurements.size()","111",&local_af0,&local_af4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_b00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_b00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  pvVar4 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b18,"measurements[0].wavelength","0.3","1e-6",pvVar4->wavelength,0.3,
             1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar1) {
    testing::Message::Message(&local_b20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_b20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_b20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  pvVar4 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  pMVar5 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar4->directComponent);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b38,"measurements[0].directComponent.value().tf","0.002","1e-6",
             pMVar5->tf,0.002,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b38);
  if (!bVar1) {
    testing::Message::Message(&local_b40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_b40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b38);
  pvVar4 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  pMVar5 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar4->directComponent);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b58,"measurements[0].directComponent.value().rf","0.047","1e-6",
             pMVar5->rf,0.047,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
  if (!bVar1) {
    testing::Message::Message(&local_b60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_b60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
  pvVar4 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  pMVar5 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar4->directComponent);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b78,"measurements[0].directComponent.value().rb","0.048","1e-6",
             pMVar5->rb,0.048,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b78);
  if (!bVar1) {
    testing::Message::Message(&local_b80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_b80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_b80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b78);
  pvVar4 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0x6e);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b98,"measurements[110].wavelength","2.5","1e-6",pvVar4->wavelength,
             2.5,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
  if (!bVar1) {
    testing::Message::Message(&local_ba0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_ba0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_ba0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
  pvVar4 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0x6e);
  pMVar5 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar4->directComponent);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_bb8,"measurements[110].directComponent.value().tf","0.822","1e-6",
             pMVar5->tf,0.822,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_bc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_bc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_bc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  pvVar4 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0x6e);
  pMVar5 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar4->directComponent);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_bd8,"measurements[110].directComponent.value().rf","0.068","1e-6",
             pMVar5->rf,0.068,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd8);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bd8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_be0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd8);
  pvVar4 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0x6e);
  pMVar5 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar4->directComponent);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_bf8,"measurements[110].directComponent.value().rb","0.068","1e-6",
             pMVar5->rb,0.068,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf8);
  if (!bVar1) {
    testing::Message::Message(&local_c00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bf8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c08,&local_c00);
    testing::internal::AssertHelper::~AssertHelper(&local_c08);
    testing::Message::~Message(&local_c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf8);
  OpticsParser::ProductData::~ProductData((ProductData *)local_998);
  std::filesystem::__cxx11::path::~path((path *)local_40);
  testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&clear_3_path.field_0x27);
  return;
}

Assistant:

TEST(TestLoadJSONFromDisk, TestLoadClear3IGSDBV2JSON)
{
    SCOPED_TRACE("Begin Test: Load CLEAR_3_IGSDB_v2.json from disk.");

    std::filesystem::path clear_3_path(TEST_DATA_DIR);
    clear_3_path /= "products";
    clear_3_path /= "igsdb_v2_clear_3.json";

    auto product = OpticsParser::parseJSONFile(clear_3_path.string());
    //    EXPECT_EQ(product.nfrcid.value(), 102);
    EXPECT_EQ(product.name, "Generic Clear Glass");
    EXPECT_EQ(product.productType, "GLAZING");
    EXPECT_EQ(product.productSubtype, "MONOLITHIC");
    EXPECT_NEAR(product.thickness.value(), 3.048, 1e-6);
    EXPECT_EQ(product.conductivity, std::optional<double>());
    EXPECT_EQ(product.IRTransmittance.value(), 0.0);
    EXPECT_NEAR(product.frontEmissivity.value(), 0.84, 1e-6);
    EXPECT_NEAR(product.backEmissivity.value(), 0.84, 1e-6);
    auto & measurements = std::get<std::vector<OpticsParser::WLData>>(product.measurements.value());
    EXPECT_EQ(measurements.size(), 111);
    EXPECT_NEAR(measurements[0].wavelength, 0.3, 1e-6);
    EXPECT_NEAR(measurements[0].directComponent.value().tf, 0.002, 1e-6);
    EXPECT_NEAR(measurements[0].directComponent.value().rf, 0.047, 1e-6);
    EXPECT_NEAR(measurements[0].directComponent.value().rb, 0.048, 1e-6);
    EXPECT_NEAR(measurements[110].wavelength, 2.5, 1e-6);
    EXPECT_NEAR(measurements[110].directComponent.value().tf, 0.822, 1e-6);
    EXPECT_NEAR(measurements[110].directComponent.value().rf, 0.068, 1e-6);
    EXPECT_NEAR(measurements[110].directComponent.value().rb, 0.068, 1e-6);
}